

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char *z;
  uint uVar4;
  int iVar5;
  char *z_00;
  sqlite3_vfs *psVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  OpenMode *pOVar17;
  uint local_6c;
  uint local_68;
  uint local_64;
  char *local_48;
  
  local_6c = *pFlags;
  uVar4 = sqlite3Strlen30(zUri);
  uVar12 = (ulong)uVar4;
  if ((uVar4 < 5 || (local_6c & 0x40) == 0 && sqlite3Config.bOpenUri == 0) ||
     (iVar5 = bcmp(zUri,"file:",5), iVar5 != 0)) {
    z_00 = (char *)sqlite3_malloc(uVar4 + 2);
    if (z_00 == (char *)0x0) {
      return 7;
    }
    memcpy(z_00,zUri,uVar12);
    (z_00 + uVar12)[0] = '\0';
    (z_00 + uVar12)[1] = '\0';
    local_6c = local_6c & 0xffffffbf;
    local_48 = zDefaultVfs;
LAB_00180559:
    psVar6 = sqlite3_vfs_find(local_48);
    *ppVfs = psVar6;
    iVar5 = 0;
    if (psVar6 != (sqlite3_vfs *)0x0) goto LAB_001805a2;
    pcVar7 = sqlite3_mprintf("no such vfs: %s",local_48);
  }
  else {
    iVar5 = uVar4 + 2;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      iVar5 = iVar5 + (uint)(zUri[uVar8] == '&');
    }
    z_00 = (char *)sqlite3_malloc(iVar5);
    if (z_00 == (char *)0x0) {
      return 7;
    }
    local_6c = local_6c | 0x40;
    uVar12 = 5;
    if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_00180663:
      iVar5 = 0;
      iVar14 = 0;
      do {
        lVar11 = (long)iVar14;
        uVar12 = uVar12 & 0xffffffff;
LAB_00180680:
        uVar4 = (uint)uVar12;
        bVar16 = zUri[(int)uVar4];
        if ((bVar16 == 0) || (bVar16 == 0x23)) {
          if (iVar5 == 1) {
            z_00[lVar11] = '\0';
            lVar11 = (long)(iVar14 + 1);
          }
          (z_00 + lVar11)[0] = '\0';
          (z_00 + lVar11)[1] = '\0';
          uVar4 = sqlite3Strlen30(z_00);
          pcVar7 = z_00;
          local_48 = zDefaultVfs;
          goto LAB_00180828;
        }
        uVar15 = uVar4 + 1;
        uVar12 = (ulong)uVar15;
        if (((bVar16 == 0x25) && (bVar1 = zUri[(int)uVar15], (""[bVar1] & 8) != 0)) &&
           (bVar2 = zUri[(long)(int)uVar4 + 2], (""[bVar2] & 8) != 0)) {
          uVar12 = (ulong)(uVar4 + 3);
          bVar16 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
                   (((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1) * '\x10';
          if (bVar16 != 0) goto LAB_001807ae;
          for (pcVar7 = zUri + (int)(uVar4 + 3);
              ((cVar3 = *pcVar7, cVar3 != '\0' && (cVar3 != '#')) &&
              ((iVar5 != 0 || (cVar3 != '?')))); pcVar7 = pcVar7 + 1) {
            if (iVar5 == 1) {
              if ((cVar3 == '&') || (cVar3 == '=')) break;
            }
            else if ((iVar5 == 2) && (cVar3 == '&')) break;
            uVar12 = (ulong)((int)uVar12 + 1);
          }
          goto LAB_00180680;
        }
        iVar10 = 1;
        if (iVar5 != 1) {
          if (((iVar5 != 0) || (bVar16 != 0x3f)) && ((iVar5 != 2 || (bVar16 != 0x26))))
          goto LAB_001807ae;
          goto LAB_001807e2;
        }
        if ((bVar16 != 0x3d) && (iVar5 = iVar10, bVar16 != 0x26)) goto LAB_001807ae;
        if (z_00[lVar11 + -1] == '\0') {
          pcVar7 = zUri + (int)uVar15;
          while( true ) {
            uVar4 = uVar4 + 1;
            uVar12 = (ulong)uVar4;
            iVar5 = iVar10;
            if (((*pcVar7 == '\0') || (*pcVar7 == '#')) || (pcVar7[-1] == '&')) break;
            pcVar7 = pcVar7 + 1;
          }
          goto LAB_00180680;
        }
        if (bVar16 != 0x26) {
          bVar16 = 0;
          iVar5 = 2;
          goto LAB_001807ae;
        }
        iVar14 = iVar14 + 1;
        z_00[lVar11] = '\0';
        lVar11 = (long)iVar14;
LAB_001807e2:
        bVar16 = 0;
        iVar5 = iVar10;
LAB_001807ae:
        iVar14 = iVar14 + 1;
        z_00[lVar11] = bVar16;
      } while( true );
    }
    for (uVar8 = 0; (zUri[uVar8 + 7] != '\0' && (zUri[uVar8 + 7] != '/')); uVar8 = uVar8 + 1) {
    }
    uVar12 = uVar8 + 7;
    if ((int)uVar12 == 0x10) {
      iVar5 = bcmp("localhost",zUri + 7,9);
      if (iVar5 == 0) {
        uVar12 = 0x10;
        goto LAB_00180663;
      }
    }
    else if ((int)uVar12 == 7) goto LAB_00180663;
    pcVar7 = sqlite3_mprintf("invalid uri authority: %.*s",uVar8 & 0xffffffff,zUri + 7);
  }
  iVar5 = 1;
LAB_00180590:
  *pzErrMsg = pcVar7;
  sqlite3_free(z_00);
  z_00 = (char *)0x0;
LAB_001805a2:
  *pFlags = local_6c;
  *pzFile = z_00;
  return iVar5;
LAB_00180828:
  if (pcVar7[(ulong)uVar4 + 1] != '\0') {
    piVar13 = (int *)(pcVar7 + (ulong)uVar4 + 1);
    uVar15 = sqlite3Strlen30((char *)piVar13);
    pcVar7 = (char *)((long)piVar13 + (ulong)uVar15 + 1);
    uVar4 = sqlite3Strlen30(pcVar7);
    if (uVar15 == 5) {
      iVar5 = bcmp("cache",piVar13,5);
      if (iVar5 == 0) {
        local_64 = 0x60000;
        local_68 = 0xfff9ffff;
        pOVar17 = sqlite3ParseUri::aCacheMode;
        pcVar9 = "cache";
        goto LAB_001808f0;
      }
    }
    else {
      if (uVar15 == 4) goto LAB_0018088a;
      if ((uVar15 == 3) && (iVar5 = bcmp("vfs",piVar13,3), iVar5 == 0)) {
        local_48 = pcVar7;
      }
    }
    goto LAB_00180828;
  }
  goto LAB_00180559;
LAB_0018088a:
  if (*piVar13 == 0x65646f6d) {
    local_64 = local_6c & 0x87;
    local_68 = 0xffffff78;
    pOVar17 = sqlite3ParseUri::aOpenMode;
    pcVar9 = "access";
LAB_001808f0:
    piVar13 = &pOVar17->mode;
    while( true ) {
      z = ((OpenMode *)(piVar13 + -2))->z;
      if (z == (char *)0x0) goto LAB_00180968;
      uVar15 = sqlite3Strlen30(z);
      if ((uVar4 == uVar15) && (iVar5 = bcmp(pcVar7,z,(ulong)uVar4), iVar5 == 0)) break;
      piVar13 = piVar13 + 4;
    }
    uVar15 = *piVar13;
    if (uVar15 == 0) {
LAB_00180968:
      pcVar7 = sqlite3_mprintf("no such %s mode: %s",pcVar9,pcVar7);
      iVar5 = 1;
      goto LAB_00180590;
    }
    if ((int)local_64 < (int)(uVar15 & 0xffffff7f)) {
      pcVar7 = sqlite3_mprintf("%s mode not allowed: %s",pcVar9,pcVar7);
      iVar5 = 3;
      goto LAB_00180590;
    }
    local_6c = uVar15 | local_68 & local_6c;
  }
  goto LAB_00180828;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */ 
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI) || sqlite3GlobalConfig.bOpenUri) 
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    int nByte = nUri+2;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen 
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc(nByte);
    if( !zFile ) return SQLITE_NOMEM;

    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;

      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s", 
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }else{
      iIn = 5;
    }

    /* Copy the filename and any query parameters into the zFile buffer. 
    ** Decode %HH escape codes along the way. 
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%' 
       && sqlite3Isxdigit(zUri[iIn]) 
       && sqlite3Isxdigit(zUri[iIn+1]) 
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#' 
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';

    /* Check if there were any options specified that should be interpreted 
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE }, 
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc(nUri+2);
    if( !zFile ) return SQLITE_NOMEM;
    memcpy(zFile, zUri, nUri);
    zFile[nUri] = '\0';
    zFile[nUri+1] = '\0';
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}